

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squserdata.h
# Opt level: O0

void __thiscall SQUserData::~SQUserData(SQUserData *this)

{
  SQTable *in_RDI;
  SQTable *this_00;
  
  (in_RDI->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQUserData_001526c0;
  this_00 = in_RDI;
  if (((in_RDI->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef & 0x80000000) == 0)
  {
    SQCollectable::RemoveFromChain
              (&((in_RDI->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)in_RDI);
  }
  SQDelegable::SetDelegate(&this_00->super_SQDelegable,in_RDI);
  SQDelegable::~SQDelegable((SQDelegable *)0x1286f8);
  return;
}

Assistant:

~SQUserData()
    {
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain, this);
        SetDelegate(NULL);
    }